

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zstd_compress.c
# Opt level: O2

size_t ZSTD_compressEnd(ZSTD_CCtx *cctx,void *dst,size_t dstCapacity,void *src,size_t srcSize)

{
  ZSTD_compressionStage_e ZVar1;
  ZSTD_CCtx_params params;
  uint uVar2;
  size_t code;
  size_t code_00;
  XXH64_hash_t XVar3;
  long lVar4;
  undefined4 *puVar5;
  ZSTD_CCtx_params *pZVar6;
  undefined8 *puVar7;
  ulong dstCapacity_00;
  undefined4 *dst_00;
  byte bVar8;
  ZSTD_format_e ZVar9;
  undefined1 auVar10 [28];
  undefined1 auVar11 [12];
  undefined1 auVar12 [24];
  undefined1 in_stack_ffffffffffffff5c [116];
  undefined1 auVar13 [24];
  
  bVar8 = 0;
  ZVar9 = ZSTD_f_zstd1_magicless;
  code = ZSTD_compressContinue_internal(cctx,dst,dstCapacity,src,srcSize,1,1);
  uVar2 = ZSTD_isError(code);
  if (uVar2 != 0) {
    return code;
  }
  ZVar1 = cctx->stage;
  if (ZVar1 == ZSTDcs_created) {
    code_00 = 0xffffffffffffffc4;
  }
  else {
    dst_00 = (undefined4 *)((long)dst + code);
    dstCapacity_00 = dstCapacity - code;
    puVar5 = dst_00;
    if (ZVar1 != ZSTDcs_ending) {
      if (ZVar1 == ZSTDcs_init) {
        pZVar6 = &cctx->appliedParams;
        puVar7 = (undefined8 *)&stack0xffffffffffffff58;
        for (lVar4 = 0xf; lVar4 != 0; lVar4 = lVar4 + -1) {
          *puVar7 = *(undefined8 *)pZVar6;
          pZVar6 = (ZSTD_CCtx_params *)((long)pZVar6 + (ulong)bVar8 * -0x10 + 8);
          puVar7 = puVar7 + (ulong)bVar8 * -2 + 1;
        }
        auVar10 = in_stack_ffffffffffffff5c._0_28_;
        auVar11 = in_stack_ffffffffffffff5c._28_12_;
        auVar12 = in_stack_ffffffffffffff5c._64_24_;
        auVar13 = in_stack_ffffffffffffff5c._92_24_;
        params.cParams.windowLog = auVar10._0_4_;
        params.cParams.chainLog = auVar10._4_4_;
        params.cParams.hashLog = auVar10._8_4_;
        params.cParams.searchLog = auVar10._12_4_;
        params.cParams.searchLength = auVar10._16_4_;
        params.cParams.targetLength = auVar10._20_4_;
        params.cParams.strategy = auVar10._24_4_;
        params.fParams.contentSizeFlag = auVar11._0_4_;
        params.fParams.checksumFlag = auVar11._4_4_;
        params.fParams.noDictIDFlag = auVar11._8_4_;
        params.compressionLevel = in_stack_ffffffffffffff5c._40_4_;
        params.disableLiteralCompression = in_stack_ffffffffffffff5c._44_4_;
        params.forceWindow = in_stack_ffffffffffffff5c._48_4_;
        params.nbWorkers = in_stack_ffffffffffffff5c._52_4_;
        params.jobSize = in_stack_ffffffffffffff5c._56_4_;
        params.overlapSizeLog = in_stack_ffffffffffffff5c._60_4_;
        params.ldmParams.enableLdm = auVar12._0_4_;
        params.ldmParams.hashLog = auVar12._4_4_;
        params.ldmParams.bucketSizeLog = auVar12._8_4_;
        params.ldmParams.minMatchLength = auVar12._12_4_;
        params.ldmParams.hashEveryLog = auVar12._16_4_;
        params.ldmParams.windowLog = auVar12._20_4_;
        params._92_4_ = in_stack_ffffffffffffff5c._88_4_;
        params.customMem.customAlloc = (ZSTD_allocFunction)auVar13._0_8_;
        params.customMem.customFree = (ZSTD_freeFunction)auVar13._8_8_;
        params.customMem.opaque = (void *)auVar13._16_8_;
        params.format = ZVar9;
        code_00 = ZSTD_writeFrameHeader(dst_00,dstCapacity_00,params,0,0);
        uVar2 = ZSTD_isError(code_00);
        if (uVar2 != 0) goto LAB_001478e5;
        dstCapacity_00 = dstCapacity_00 - code_00;
        cctx->stage = ZSTDcs_ongoing;
        puVar5 = (undefined4 *)(code_00 + (long)dst_00);
      }
      code_00 = 0xffffffffffffffba;
      if (dstCapacity_00 < 4) goto LAB_001478e5;
      *puVar5 = 1;
      dstCapacity_00 = dstCapacity_00 - 3;
      puVar5 = (undefined4 *)((long)puVar5 + 3);
    }
    if ((cctx->appliedParams).fParams.checksumFlag != 0) {
      XVar3 = XXH64_digest(&cctx->xxhState);
      code_00 = 0xffffffffffffffba;
      if (dstCapacity_00 < 4) goto LAB_001478e5;
      *puVar5 = (int)XVar3;
      puVar5 = puVar5 + 1;
    }
    cctx->stage = ZSTDcs_created;
    code_00 = (long)puVar5 - (long)dst_00;
  }
LAB_001478e5:
  uVar2 = ZSTD_isError(code_00);
  if (uVar2 == 0) {
    if ((cctx->pledgedSrcSizePlusOne == 0) ||
       (cctx->pledgedSrcSizePlusOne == cctx->consumedSrcSize + 1)) {
      code_00 = code_00 + code;
    }
    else {
      code_00 = 0xffffffffffffffb8;
    }
  }
  return code_00;
}

Assistant:

size_t ZSTD_compressEnd (ZSTD_CCtx* cctx,
                         void* dst, size_t dstCapacity,
                   const void* src, size_t srcSize)
{
    size_t endResult;
    size_t const cSize = ZSTD_compressContinue_internal(cctx,
                                dst, dstCapacity, src, srcSize,
                                1 /* frame mode */, 1 /* last chunk */);
    if (ZSTD_isError(cSize)) return cSize;
    endResult = ZSTD_writeEpilogue(cctx, (char*)dst + cSize, dstCapacity-cSize);
    if (ZSTD_isError(endResult)) return endResult;
    assert(!(cctx->appliedParams.fParams.contentSizeFlag && cctx->pledgedSrcSizePlusOne == 0));
    if (cctx->pledgedSrcSizePlusOne != 0) {  /* control src size */
        ZSTD_STATIC_ASSERT(ZSTD_CONTENTSIZE_UNKNOWN == (unsigned long long)-1);
        DEBUGLOG(4, "end of frame : controlling src size");
        if (cctx->pledgedSrcSizePlusOne != cctx->consumedSrcSize+1) {
            DEBUGLOG(4, "error : pledgedSrcSize = %u, while realSrcSize = %u",
                (U32)cctx->pledgedSrcSizePlusOne-1, (U32)cctx->consumedSrcSize);
            return ERROR(srcSize_wrong);
    }   }
    return cSize + endResult;
}